

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

void __thiscall
flatbuffers::FlatBufPrinter::Print
          (FlatBufPrinter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,char *string_template)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  undefined8 uVar4;
  _Self local_98;
  key_type local_90;
  _Self local_70;
  const_iterator it;
  size_t pos2;
  size_t pos;
  allocator<char> local_41;
  string local_40 [8];
  string s;
  char *string_template_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_local;
  FlatBufPrinter *this_local;
  
  s.field_2._8_8_ = string_template;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,string_template,&local_41);
  std::allocator<char>::~allocator(&local_41);
  while ((uVar2 = std::__cxx11::string::find((char)local_40,(ulong)(uint)(int)this->escape_char_),
         uVar2 != 0xffffffffffffffff &&
         (it._M_node = (_Base_ptr)
                       std::__cxx11::string::find
                                 ((char)local_40,(ulong)(uint)(int)this->escape_char_),
         it._M_node != (_Base_ptr)0xffffffffffffffff))) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)local_40);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(vars,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(vars);
    bVar1 = std::operator==(&local_70,&local_98);
    if (bVar1) break;
    psVar3 = (string *)((long)it._M_node + (1 - uVar2));
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_70);
    std::__cxx11::string::replace((ulong)local_40,uVar2,psVar3);
  }
  uVar4 = std::__cxx11::string::c_str();
  (*(this->super_Printer)._vptr_Printer[3])(this,uVar4);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Print(const std::map<std::string, std::string> &vars,
             const char *string_template) {
    std::string s = string_template;
    // Replace any occurrences of strings in "vars" that are surrounded
    // by the escape character by what they're mapped to.
    size_t pos;
    while ((pos = s.find(escape_char_)) != std::string::npos) {
      // Found an escape char, must also find the closing one.
      size_t pos2 = s.find(escape_char_, pos + 1);
      // If placeholder not closed, ignore.
      if (pos2 == std::string::npos) break;
      auto it = vars.find(s.substr(pos + 1, pos2 - pos - 1));
      // If unknown placeholder, ignore.
      if (it == vars.end()) break;
      // Subtitute placeholder.
      s.replace(pos, pos2 - pos + 1, it->second);
    }
    Print(s.c_str());
  }